

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_service_flag_pending(lws_context *context,int tsi)

{
  uint uVar1;
  lws_dll2 *plVar2;
  lws *wsi_1;
  lws_dll2 *p1;
  lws_dll2 *p;
  lws *wsi;
  lws_dll2 *d;
  int forced;
  lws_context_per_thread *pt;
  int tsi_local;
  lws_context *context_local;
  
  d._4_4_ = 0;
  if (context == (lws_context *)0x0) {
    context_local._4_4_ = 1;
  }
  else {
    for (wsi = (lws *)context->pt[tsi].dll_buflist_owner.head; wsi != (lws *)0x0;
        wsi = (lws *)(wsi->a).vhost) {
      if ((*(char *)&(wsi->same_vh_protocol).prev == '\0') &&
         (((ulong)(wsi->sul_connect_timeout).list.owner & 0xffff00000000) != 0x11000000000)) {
        d._4_4_ = 1;
        break;
      }
    }
    uVar1 = rops_service_flag_pending_ws(context,tsi);
    d._4_4_ = uVar1 | d._4_4_;
    plVar2 = lws_dll2_get_head(&context->pt[tsi].tls.dll_pending_tls_owner);
    while (p1 = plVar2, p1 != (lws_dll2 *)0x0) {
      plVar2 = p1->next;
      if ((-1 < *(int *)((long)&p1[4].prev + 4)) &&
         (context->pt[tsi].fds[*(int *)((long)&p1[4].prev + 4)].revents =
               context->pt[tsi].fds[*(int *)((long)&p1[4].prev + 4)].revents |
               context->pt[tsi].fds[*(int *)((long)&p1[4].prev + 4)].events & 1U,
         (context->pt[tsi].fds[*(int *)((long)&p1[4].prev + 4)].revents & 1U) != 0)) {
        d._4_4_ = 1;
      }
    }
    context_local._4_4_ = d._4_4_;
  }
  return context_local._4_4_;
}

Assistant:

int
lws_service_flag_pending(struct lws_context *context, int tsi)
{
	struct lws_context_per_thread *pt;
	int forced = 0;

	if (!context)
		return 1;

	pt = &context->pt[tsi];

	lws_pt_lock(pt, __func__);

	/*
	 * 1) If there is any wsi with a buflist and in a state to process
	 *    it, we should not wait in poll
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		if (!lws_is_flowcontrolled(wsi) &&
		     lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			forced = 1;
			break;
		}
	} lws_end_foreach_dll(d);

#if defined(LWS_ROLE_WS)
	forced |= lws_rops_func_fidx(&role_ops_ws,
				     LWS_ROPS_service_flag_pending).
					service_flag_pending(context, tsi);
#endif

#if defined(LWS_WITH_TLS)
	/*
	 * 2) For all guys with buffered SSL read data already saved up, if they
	 * are not flowcontrolled, fake their POLLIN status so they'll get
	 * service to use up the buffered incoming data, even though their
	 * network socket may have nothing
	 */
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
			lws_dll2_get_head(&pt->tls.dll_pending_tls_owner)) {
		struct lws *wsi = lws_container_of(p, struct lws,
						   tls.dll_pending_tls);

		if (wsi->position_in_fds_table >= 0) {

			pt->fds[wsi->position_in_fds_table].revents = (short)(
					pt->fds[wsi->position_in_fds_table].revents |
				(pt->fds[wsi->position_in_fds_table].events &
								LWS_POLLIN));
			if (pt->fds[wsi->position_in_fds_table].revents &
								LWS_POLLIN)
				/*
				 * We're not going to remove the wsi from the
				 * pending tls list.  The processing will have
				 * to do it if he exhausts the pending tls.
				 */
				forced = 1;
		}

	} lws_end_foreach_dll_safe(p, p1);
#endif

	lws_pt_unlock(pt);

	return forced;
}